

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_crt_check_cn(mbedtls_x509_buf *name,char *cn,size_t cn_len)

{
  ulong uVar1;
  uchar *puVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  uVar1 = name->len;
  if ((uVar1 == cn_len) && (iVar3 = x509_memcasecmp(cn,name->p,cn_len), iVar3 == 0)) {
    return 0;
  }
  sVar4 = strlen(cn);
  if (((2 < uVar1) && (puVar2 = name->p, *puVar2 == '*')) && (puVar2[1] == '.')) {
    for (lVar5 = 0; sVar4 - lVar5 != 0; lVar5 = lVar5 + 1) {
      if (cn[lVar5] == '.') {
        if (lVar5 == 0) {
          return -1;
        }
        if ((sVar4 - uVar1) + 1 != lVar5) {
          return -1;
        }
        iVar3 = x509_memcasecmp(puVar2 + 1,cn + lVar5,sVar4 - lVar5);
        if (iVar3 != 0) {
          return -1;
        }
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

static int x509_crt_check_cn(const mbedtls_x509_buf *name,
                             const char *cn, size_t cn_len)
{
    /* try exact match */
    if (name->len == cn_len &&
        x509_memcasecmp(cn, name->p, cn_len) == 0) {
        return 0;
    }

    /* try wildcard match */
    if (x509_check_wildcard(cn, name) == 0) {
        return 0;
    }

    return -1;
}